

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pe.cc
# Opt level: O2

void __thiscall
bloaty::pe::PEObjectFile::ProcessFile
          (PEObjectFile *this,
          vector<bloaty::RangeSink_*,_std::allocator<bloaty::RangeSink_*>_> *sinks)

{
  pointer ppRVar1;
  RangeSink *sink;
  pointer ppRVar2;
  
  ppRVar2 = (sinks->super__Vector_base<bloaty::RangeSink_*,_std::allocator<bloaty::RangeSink_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  ppRVar1 = (sinks->super__Vector_base<bloaty::RangeSink_*,_std::allocator<bloaty::RangeSink_*>_>).
            _M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (ppRVar2 == ppRVar1) {
      return;
    }
    sink = *ppRVar2;
    if (1 < sink->data_source_ - kSections) break;
    ParseSections((this->pe_file)._M_t.
                  super___uniq_ptr_impl<bloaty::pe::PeFile,_std::default_delete<bloaty::pe::PeFile>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_bloaty::pe::PeFile_*,_std::default_delete<bloaty::pe::PeFile>_>
                  .super__Head_base<0UL,_bloaty::pe::PeFile_*,_false>._M_head_impl,sink);
    AddCatchAll((this->pe_file)._M_t.
                super___uniq_ptr_impl<bloaty::pe::PeFile,_std::default_delete<bloaty::pe::PeFile>_>.
                _M_t.
                super__Tuple_impl<0UL,_bloaty::pe::PeFile_*,_std::default_delete<bloaty::pe::PeFile>_>
                .super__Head_base<0UL,_bloaty::pe::PeFile_*,_false>._M_head_impl,sink);
    ppRVar2 = ppRVar2 + 1;
  }
  Throw("PE doesn\'t support this data source",0xf7);
}

Assistant:

void ProcessFile(const std::vector<RangeSink*>& sinks) const override {
    for (auto sink : sinks) {
      switch (sink->data_source()) {
        case DataSource::kSegments:
          // TODO(mj): sections: list out imports and other stuff!
        case DataSource::kSections:
          ParseSections(*pe_file, sink);
          break;
        case DataSource::kSymbols:
        case DataSource::kRawSymbols:
        case DataSource::kShortSymbols:
        case DataSource::kFullSymbols:
          // TODO(mj): Generate symbols from debug info, exports, imports, tls
          // data, relocations, resources ...
        case DataSource::kArchiveMembers:
        case DataSource::kCompileUnits:
        case DataSource::kInlines:
        default:
          THROW("PE doesn't support this data source");
      }
      AddCatchAll(*pe_file, sink);
    }
  }